

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall flatbuffers::cpp::CppGenerator::GenTable(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppFVar2;
  FieldDef *pFVar3;
  EnumVal *ev;
  Namespace *ns;
  StructDef *pSVar4;
  mapped_type *pmVar5;
  long *plVar6;
  undefined8 *puVar7;
  pointer ppEVar8;
  EnumDef *pEVar9;
  size_type *psVar10;
  ulong *puVar11;
  FieldDef **field;
  CppGenerator *pCVar12;
  pointer ppFVar13;
  EnumDef *pEVar14;
  pointer ppEVar15;
  undefined8 uVar16;
  string nfn;
  key_type local_598;
  string local_578;
  CppGenerator *local_558;
  string local_550;
  string local_530;
  IDLOptions *local_510;
  EnumDef *local_508;
  StructDef *local_500;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  pointer local_398;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->opts_).super_IDLOptions.generate_object_based_api == true) {
    GenNativeTable(this,struct_def);
  }
  GenComment(this,&(struct_def->super_Definition).doc_comment,"");
  paVar1 = &local_598.field_2;
  local_598._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"STRUCT_NAME","");
  EscapeKeyword(&local_578,this,(string *)struct_def);
  this_00 = &this->code_;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_598);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  local_558 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != paVar1) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "struct {{STRUCT_NAME}} FLATBUFFERS_FINAL_CLASS : private ::flatbuffers::Table {","");
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((local_558->opts_).super_IDLOptions.generate_object_based_api == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"  typedef {{NATIVE_NAME}} NativeTableType;","");
    CodeWriter::operator+=(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"  typedef {{STRUCT_NAME}}Builder Builder;","");
  CodeWriter::operator+=(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pCVar12 = local_558;
  GenBinarySchemaTypeDef(local_558,((local_558->super_BaseGenerator).parser_)->root_struct_def_);
  if (1 < *(int *)&(pCVar12->opts_).super_IDLOptions.field_0x30c) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"  struct Traits;","");
    CodeWriter::operator+=(this_00,&local_b0);
    pCVar12 = local_558;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pCVar12->opts_).super_IDLOptions.mini_reflect != kNone) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "  static const ::flatbuffers::TypeTable *MiniReflectTypeTable() {","");
    CodeWriter::operator+=(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"    return {{STRUCT_NAME}}TypeTable();","");
    CodeWriter::operator+=(this_00,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"  }","");
    CodeWriter::operator+=(this_00,&local_110);
    pCVar12 = local_558;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  EscapeKeyword(&local_598,pCVar12,(string *)struct_def);
  GenFullyQualifiedNameGetter(pCVar12,struct_def,&local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != paVar1) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  local_500 = struct_def;
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_598._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"SEP","");
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_598);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != paVar1) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,
               "  enum FlatBuffersVTableOffset FLATBUFFERS_VTABLE_UNDERLYING_TYPE {","");
    CodeWriter::operator+=(this_00,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    ppFVar13 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar2 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar13 != ppFVar2) {
      do {
        if ((*ppFVar13)->deprecated == false) {
          local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"OFFSET_NAME","");
          GenFieldOffsetName_abi_cxx11_(&local_578,local_558,*ppFVar13);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_598);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._M_dataplus._M_p != &local_598.field_2) {
            operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
          }
          local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"OFFSET_VALUE","");
          NumToString<unsigned_short>(&local_578,((*ppFVar13)->value).offset);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_598);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._M_dataplus._M_p != &local_598.field_2) {
            operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
          }
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"{{SEP}}    {{OFFSET_NAME}} = {{OFFSET_VALUE}}\\","");
          CodeWriter::operator+=(this_00,&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"SEP","");
          local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,",\n","");
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_598);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._M_dataplus._M_p != &local_598.field_2) {
            operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
          }
        }
        ppFVar13 = ppFVar13 + 1;
      } while (ppFVar13 != ppFVar2);
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
    CodeWriter::operator+=(this_00,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"  };","");
    CodeWriter::operator+=(this_00,&local_170);
    struct_def = local_500;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  pEVar14 = (EnumDef *)
            (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pEVar9 = (EnumDef *)
           (struct_def->fields).vec.
           super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar14 != pEVar9) {
    local_508 = pEVar9;
    do {
      if (((FieldDef *)(pEVar14->super_Definition).name._M_dataplus._M_p)->deprecated == false) {
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"FIELD_NAME","");
        Name_abi_cxx11_(&local_578,local_558,
                        (FieldDef *)(pEVar14->super_Definition).name._M_dataplus._M_p);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_598);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        pCVar12 = local_558;
        GenTableFieldGetter(local_558,(FieldDef *)(pEVar14->super_Definition).name._M_dataplus._M_p)
        ;
        if ((pCVar12->opts_).super_IDLOptions.mutable_buffer == true) {
          GenTableFieldSetter(pCVar12,(FieldDef *)(pEVar14->super_Definition).name._M_dataplus._M_p)
          ;
        }
        GetNestedFlatBufferName_abi_cxx11_
                  (&local_598,pCVar12,(FieldDef *)(pEVar14->super_Definition).name._M_dataplus._M_p)
        ;
        if (local_598._M_string_length != 0) {
          local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"CPP_NAME","");
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_578);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3b8,
                     "  const {{CPP_NAME}} *{{FIELD_NAME}}_nested_root() const {","");
          CodeWriter::operator+=(this_00,&local_3b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3d8,"    const auto _f = {{FIELD_NAME}}();","");
          CodeWriter::operator+=(this_00,&local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3f8,
                     "    return _f ? ::flatbuffers::GetRoot<{{CPP_NAME}}>(_f->Data())","");
          CodeWriter::operator+=(this_00,&local_3f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_418,"              : nullptr;","");
          CodeWriter::operator+=(this_00,&local_418);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"  }","");
          CodeWriter::operator+=(this_00,&local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
        }
        if (((FieldDef *)(pEVar14->super_Definition).name._M_dataplus._M_p)->flexbuffer == true) {
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_458,
                     "  flexbuffers::Reference {{FIELD_NAME}}_flexbuffer_root() const {","");
          CodeWriter::operator+=(this_00,&local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_478,"    const auto _f = {{FIELD_NAME}}();","");
          CodeWriter::operator+=(this_00,&local_478);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_498,
                     "    return _f ? flexbuffers::GetRoot(_f->Data(), _f->size())","");
          CodeWriter::operator+=(this_00,&local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4b8,"              : flexbuffers::Reference();","");
          CodeWriter::operator+=(this_00,&local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
          }
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"  }","");
          CodeWriter::operator+=(this_00,&local_4d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
        }
        pFVar3 = (FieldDef *)(pEVar14->super_Definition).name._M_dataplus._M_p;
        if (pFVar3->key == true) {
          GenKeyFieldMethods(local_558,pFVar3);
        }
        pEVar9 = local_508;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
          pEVar9 = local_508;
        }
      }
      pEVar14 = (EnumDef *)&(pEVar14->super_Definition).name._M_string_length;
    } while (pEVar14 != pEVar9);
  }
  pSVar4 = local_500;
  if ((local_558->opts_).super_IDLOptions.cpp_static_reflection != false) {
    GenIndexBasedFieldGetter(local_558,local_500);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"  bool Verify(::flatbuffers::Verifier &verifier) const {","");
  CodeWriter::operator+=(this_00,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,"    return VerifyTableStart(verifier)\\","");
  CodeWriter::operator+=(this_00,&local_1b0);
  paVar1 = &local_598.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  ppFVar2 = (pSVar4->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar13 = (pSVar4->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar13 != ppFVar2;
      ppFVar13 = ppFVar13 + 1) {
    if ((*ppFVar13)->deprecated == false) {
      GenVerifyCall(local_558,*ppFVar13," &&\n           ");
    }
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0," &&\n           verifier.EndTable();","");
  CodeWriter::operator+=(this_00,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"  }","");
  CodeWriter::operator+=(this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  pCVar12 = local_558;
  local_510 = &(local_558->opts_).super_IDLOptions;
  if ((local_558->opts_).super_IDLOptions.generate_object_based_api == true) {
    TableUnPackSignature_abi_cxx11_(&local_578,local_558,pSVar4,true,local_510);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,0x36edba);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_598.field_2._M_allocated_capacity = *psVar10;
      local_598.field_2._8_8_ = plVar6[3];
      local_598._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_598.field_2._M_allocated_capacity = *psVar10;
      local_598._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_598._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_598);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_330.field_2._M_allocated_capacity = *psVar10;
      local_330.field_2._8_8_ = plVar6[3];
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    }
    else {
      local_330.field_2._M_allocated_capacity = *psVar10;
      local_330._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_330._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != paVar1) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    TableUnPackToSignature_abi_cxx11_(&local_578,pCVar12,pSVar4,true,local_510);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,0x36edba);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_598.field_2._M_allocated_capacity = *psVar10;
      local_598.field_2._8_8_ = plVar6[3];
      local_598._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_598.field_2._M_allocated_capacity = *psVar10;
      local_598._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_598._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_598);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_350.field_2._M_allocated_capacity = *psVar10;
      local_350.field_2._8_8_ = plVar6[3];
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    }
    else {
      local_350.field_2._M_allocated_capacity = *psVar10;
      local_350._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_350._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != paVar1) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    TablePackSignature_abi_cxx11_(&local_578,pCVar12,pSVar4,true,local_510);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,0x36edba);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_598.field_2._M_allocated_capacity = *psVar10;
      local_598.field_2._8_8_ = plVar6[3];
      local_598._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_598.field_2._M_allocated_capacity = *psVar10;
      local_598._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_598._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_598);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_370.field_2._M_allocated_capacity = *psVar10;
      local_370.field_2._8_8_ = plVar6[3];
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    }
    else {
      local_370.field_2._M_allocated_capacity = *psVar10;
      local_370._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_370._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != paVar1) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"};","");
  CodeWriter::operator+=(this_00,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
  CodeWriter::operator+=(this_00,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  ppFVar13 = (pSVar4->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_398 = (pSVar4->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  pCVar12 = local_558;
  if (ppFVar13 != local_398) {
    do {
      pFVar3 = *ppFVar13;
      if (((pFVar3->deprecated == false) && ((pFVar3->value).type.base_type == BASE_TYPE_UNION)) &&
         (local_508 = (pFVar3->value).type.enum_def,
         local_508->uses_multiple_type_instances == false)) {
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"FIELD_NAME","");
        Name_abi_cxx11_(&local_578,pCVar12,*ppFVar13);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_598);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        ppEVar8 = (local_508->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar15 = (local_508->vals).vec.
                        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppEVar15 != ppEVar8;
            ppEVar15 = ppEVar15 + 1) {
          ev = *ppEVar15;
          if ((ev->union_type).base_type != BASE_TYPE_NONE) {
            GetUnionElement_abi_cxx11_(&local_598,pCVar12,ev,false,local_510);
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_578,"U_ELEMENT_TYPE","");
            ns = (local_508->super_Definition).defined_namespace;
            GetEnumValUse_abi_cxx11_(&local_530,pCVar12,local_508,ev);
            BaseGenerator::WrapInNameSpace(&local_550,&pCVar12->super_BaseGenerator,ns,&local_530);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this_00->value_map_,&local_578);
            std::__cxx11::string::_M_assign((string *)pmVar5);
            pCVar12 = local_558;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._M_dataplus._M_p != &local_550.field_2) {
              operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"U_FIELD_TYPE","");
            std::operator+(&local_530,"const ",&local_598);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_530);
            local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_550.field_2._M_allocated_capacity = *psVar10;
              local_550.field_2._8_8_ = plVar6[3];
            }
            else {
              local_550.field_2._M_allocated_capacity = *psVar10;
              local_550._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_550._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this_00->value_map_,&local_578);
            std::__cxx11::string::_M_assign((string *)pmVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._M_dataplus._M_p != &local_550.field_2) {
              operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_578,"U_ELEMENT_NAME","");
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this_00->value_map_,&local_578);
            std::__cxx11::string::_M_assign((string *)pmVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
            local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"U_FIELD_NAME","");
            Name_abi_cxx11_(&local_290,pCVar12,*ppFVar13);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
            local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
            puVar11 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_530.field_2._M_allocated_capacity = *puVar11;
              local_530.field_2._8_8_ = plVar6[3];
            }
            else {
              local_530.field_2._M_allocated_capacity = *puVar11;
              local_530._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_530._M_string_length = plVar6[1];
            *plVar6 = (long)puVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            EscapeKeyword(&local_4f8,pCVar12,&ev->name);
            uVar16 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              uVar16 = local_530.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < local_4f8._M_string_length + local_530._M_string_length) {
              uVar16 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
                uVar16 = local_4f8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar16 < local_4f8._M_string_length + local_530._M_string_length)
              goto LAB_0016c230;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_4f8,0,(char *)0x0,(ulong)local_530._M_dataplus._M_p)
              ;
            }
            else {
LAB_0016c230:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_530,(ulong)local_4f8._M_dataplus._M_p);
            }
            local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
            psVar10 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_550.field_2._M_allocated_capacity = *psVar10;
              local_550.field_2._8_8_ = puVar7[3];
            }
            else {
              local_550.field_2._M_allocated_capacity = *psVar10;
              local_550._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_550._M_string_length = puVar7[1];
            *puVar7 = psVar10;
            puVar7[1] = 0;
            *(undefined1 *)psVar10 = 0;
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this_00->value_map_,&local_578);
            std::__cxx11::string::_M_assign((string *)pmVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._M_dataplus._M_p != &local_550.field_2) {
              operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
              operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_578._M_dataplus._M_p != &local_578.field_2) {
              operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1
                             );
            }
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2b0,
                       "template<> inline {{U_FIELD_TYPE}}{{STRUCT_NAME}}::{{FIELD_NAME}}_as<{{U_ELEMENT_NAME}}>() const {"
                       ,"");
            CodeWriter::operator+=(this_00,&local_2b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d0,"  return {{U_FIELD_NAME}}();","");
            CodeWriter::operator+=(this_00,&local_2d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"}","");
            CodeWriter::operator+=(this_00,&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"");
            CodeWriter::operator+=(this_00,&local_310);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._M_dataplus._M_p != &local_598.field_2) {
              operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1
                             );
            }
            ppEVar8 = (local_508->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pCVar12 = local_558;
          }
        }
      }
      ppFVar13 = ppFVar13 + 1;
    } while (ppFVar13 != local_398);
  }
  pSVar4 = local_500;
  GenBuilders(pCVar12,local_500);
  if ((pCVar12->opts_).super_IDLOptions.generate_object_based_api != false) {
    TableCreateSignature_abi_cxx11_(&local_598,pCVar12,pSVar4,true,local_510);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_598);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_390.field_2._M_allocated_capacity = *psVar10;
      local_390.field_2._8_8_ = plVar6[3];
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    }
    else {
      local_390.field_2._M_allocated_capacity = *psVar10;
      local_390._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_390._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
    CodeWriter::operator+=(this_00,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenTable(const StructDef &struct_def) {
    if (opts_.generate_object_based_api) { GenNativeTable(struct_def); }

    // Generate an accessor struct, with methods of the form:
    // type name() const { return GetField<type>(offset, defaultval); }
    GenComment(struct_def.doc_comment);

    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_ +=
        "struct {{STRUCT_NAME}} FLATBUFFERS_FINAL_CLASS"
        " : private ::flatbuffers::Table {";
    if (opts_.generate_object_based_api) {
      code_ += "  typedef {{NATIVE_NAME}} NativeTableType;";
    }
    code_ += "  typedef {{STRUCT_NAME}}Builder Builder;";
    GenBinarySchemaTypeDef(parser_.root_struct_def_);

    if (opts_.g_cpp_std >= cpp::CPP_STD_17) { code_ += "  struct Traits;"; }
    if (opts_.mini_reflect != IDLOptions::kNone) {
      code_ +=
          "  static const ::flatbuffers::TypeTable *MiniReflectTypeTable() {";
      code_ += "    return {{STRUCT_NAME}}TypeTable();";
      code_ += "  }";
    }

    GenFullyQualifiedNameGetter(struct_def, Name(struct_def));

    // Generate field id constants.
    if (!struct_def.fields.vec.empty()) {
      // We need to add a trailing comma to all elements except the last one as
      // older versions of gcc complain about this.
      code_.SetValue("SEP", "");
      code_ +=
          "  enum FlatBuffersVTableOffset FLATBUFFERS_VTABLE_UNDERLYING_TYPE {";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) {
          // Deprecated fields won't be accessible.
          continue;
        }

        code_.SetValue("OFFSET_NAME", GenFieldOffsetName(*field));
        code_.SetValue("OFFSET_VALUE", NumToString(field->value.offset));
        code_ += "{{SEP}}    {{OFFSET_NAME}} = {{OFFSET_VALUE}}\\";
        code_.SetValue("SEP", ",\n");
      }
      code_ += "";
      code_ += "  };";
    }

    // Generate the accessors.
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated) {
        // Deprecated fields won't be accessible.
        continue;
      }

      code_.SetValue("FIELD_NAME", Name(*field));
      GenTableFieldGetter(*field);
      if (opts_.mutable_buffer) { GenTableFieldSetter(*field); }

      auto nfn = GetNestedFlatBufferName(*field);
      if (!nfn.empty()) {
        code_.SetValue("CPP_NAME", nfn);
        code_ += "  const {{CPP_NAME}} *{{FIELD_NAME}}_nested_root() const {";
        code_ += "    const auto _f = {{FIELD_NAME}}();";
        code_ +=
            "    return _f ? ::flatbuffers::GetRoot<{{CPP_NAME}}>(_f->Data())";
        code_ += "              : nullptr;";
        code_ += "  }";
      }

      if (field->flexbuffer) {
        code_ +=
            "  flexbuffers::Reference {{FIELD_NAME}}_flexbuffer_root()"
            " const {";
        // Both Data() and size() are const-methods, therefore call order
        // doesn't matter.
        code_ += "    const auto _f = {{FIELD_NAME}}();";
        code_ += "    return _f ? flexbuffers::GetRoot(_f->Data(), _f->size())";
        code_ += "              : flexbuffers::Reference();";
        code_ += "  }";
      }

      // Generate a comparison function for this field if it is a key.
      if (field->key) { GenKeyFieldMethods(*field); }
    }

    if (opts_.cpp_static_reflection) { GenIndexBasedFieldGetter(struct_def); }

    // Generate a verifier function that can check a buffer from an untrusted
    // source will never cause reads outside the buffer.
    code_ += "  bool Verify(::flatbuffers::Verifier &verifier) const {";
    code_ += "    return VerifyTableStart(verifier)\\";
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated) { continue; }
      GenVerifyCall(*field, " &&\n           ");
    }

    code_ += " &&\n           verifier.EndTable();";
    code_ += "  }";

    if (opts_.generate_object_based_api) {
      // Generate the UnPack() pre declaration.
      code_ += "  " + TableUnPackSignature(struct_def, true, opts_) + ";";
      code_ += "  " + TableUnPackToSignature(struct_def, true, opts_) + ";";
      code_ += "  " + TablePackSignature(struct_def, true, opts_) + ";";
    }

    code_ += "};";  // End of table.
    code_ += "";

    // Explicit specializations for union accessors
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated || field->value.type.base_type != BASE_TYPE_UNION) {
        continue;
      }

      auto u = field->value.type.enum_def;
      if (u->uses_multiple_type_instances) continue;

      code_.SetValue("FIELD_NAME", Name(*field));

      for (auto u_it = u->Vals().begin(); u_it != u->Vals().end(); ++u_it) {
        auto &ev = **u_it;
        if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }

        auto full_struct_name = GetUnionElement(ev, false, opts_);

        code_.SetValue(
            "U_ELEMENT_TYPE",
            WrapInNameSpace(u->defined_namespace, GetEnumValUse(*u, ev)));
        code_.SetValue("U_FIELD_TYPE", "const " + full_struct_name + " *");
        code_.SetValue("U_ELEMENT_NAME", full_struct_name);
        code_.SetValue("U_FIELD_NAME", Name(*field) + "_as_" + Name(ev));

        // `template<> const T *union_name_as<T>() const` accessor.
        code_ +=
            "template<> "
            "inline {{U_FIELD_TYPE}}{{STRUCT_NAME}}::{{FIELD_NAME}}_as"
            "<{{U_ELEMENT_NAME}}>() const {";
        code_ += "  return {{U_FIELD_NAME}}();";
        code_ += "}";
        code_ += "";
      }
    }

    GenBuilders(struct_def);

    if (opts_.generate_object_based_api) {
      // Generate a pre-declaration for a CreateX method that works with an
      // unpacked C++ object.
      code_ += TableCreateSignature(struct_def, true, opts_) + ";";
      code_ += "";
    }
  }